

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerSession.cpp
# Opt level: O0

void __thiscall ki::protocol::net::ServerSession::on_session_accept(ServerSession *this)

{
  uint16_t uVar1;
  rep rVar2;
  undefined8 uVar3;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_78;
  duration<long,_std::ratio<1L,_1000000000L>_> local_70;
  duration<long,_std::ratio<1L,_1L>_> local_68;
  undefined4 local_5c;
  parse_error *e;
  SessionAccept local_40;
  undefined1 local_28 [8];
  SessionAccept accept;
  ServerSession *this_local;
  
  accept._16_8_ = this;
  control::SessionAccept::SessionAccept((SessionAccept *)local_28,0,0,0);
  Session::read_data<ki::protocol::control::SessionAccept>
            (&local_40,
             (Session *)((long)&this->_vptr_ServerSession + (long)this->_vptr_ServerSession[-3]));
  control::SessionAccept::operator=((SessionAccept *)local_28,&local_40);
  control::SessionAccept::~SessionAccept(&local_40);
  local_78.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_70.__r = (rep)std::chrono::operator-
                                (&local_78,
                                 (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)(&this->field_0x18 + (long)this->_vptr_ServerSession[-3]));
  local_68.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                                (&local_70);
  rVar2 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_68);
  if (rVar2 < 4) {
    uVar1 = control::SessionAccept::get_session_id((SessionAccept *)local_28);
    if (uVar1 == *(uint16_t *)(&this->field_0x8 + (long)this->_vptr_ServerSession[-3])) {
      (&this->field_0xa)[(long)this->_vptr_ServerSession[-3]] = 1;
      uVar3 = std::chrono::_V2::steady_clock::now();
      *(undefined8 *)(&this->field_0x20 + (long)this->_vptr_ServerSession[-3]) = uVar3;
      *(undefined8 *)(&this->field_0x28 + (long)this->_vptr_ServerSession[-3]) =
           *(undefined8 *)(&this->field_0x20 + (long)this->_vptr_ServerSession[-3]);
      (*this->_vptr_ServerSession[3])();
      local_5c = 0;
    }
    else {
      (**(code **)(*(long *)((long)&this->_vptr_ServerSession + (long)this->_vptr_ServerSession[-3])
                  + 0x38))
                ((_func_int *)
                 ((long)&this->_vptr_ServerSession + (long)this->_vptr_ServerSession[-3]),6);
      local_5c = 1;
    }
  }
  else {
    (**(code **)(*(long *)((long)&this->_vptr_ServerSession + (long)this->_vptr_ServerSession[-3]) +
                0x38))((_func_int *)
                       ((long)&this->_vptr_ServerSession + (long)this->_vptr_ServerSession[-3]),7);
    local_5c = 1;
  }
  control::SessionAccept::~SessionAccept((SessionAccept *)local_28);
  return;
}

Assistant:

void ServerSession::on_session_accept()
	{
		// Read the payload data into a structure
		control::SessionAccept accept;
		try
		{
			accept = read_data<control::SessionAccept>();
		}
		catch (parse_error &e)
		{
			// The SESSION_ACCEPT wasn't valid...
			// Close the session
			close(SessionCloseErrorCode::INVALID_MESSAGE);
			return;
		}

		// Should this session have already timed out?
		if (std::chrono::duration_cast<std::chrono::seconds>(
				std::chrono::steady_clock::now() - m_connection_time
			).count() > KI_CONNECTION_TIMEOUT)
		{
			close(SessionCloseErrorCode::SESSION_OFFER_TIMED_OUT);
			return;
		}

		// Make sure they're accepting this session
		if (accept.get_session_id() != m_id)
		{
			close(SessionCloseErrorCode::INVALID_MESSAGE);
			return;
		}

		// The session is successfully established
		m_established = true;
		m_establish_time = std::chrono::steady_clock::now();
		m_last_received_heartbeat_time = m_establish_time;
		on_established();
	}